

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O3

void __thiscall
hanabi_learning_env::HanabiHand::AddCard
          (HanabiHand *this,HanabiCard card,CardKnowledge *initial_knowledge)

{
  pointer *ppHVar1;
  iterator __position;
  HanabiCard local_18;
  
  local_18 = card;
  if (((ulong)card & 0x8000000080000000) == 0) {
    __position._M_current =
         (this->cards_).
         super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->cards_).
        super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<hanabi_learning_env::HanabiCard,std::allocator<hanabi_learning_env::HanabiCard>>::
      _M_realloc_insert<hanabi_learning_env::HanabiCard_const&>
                ((vector<hanabi_learning_env::HanabiCard,std::allocator<hanabi_learning_env::HanabiCard>>
                  *)this,__position,&local_18);
    }
    else {
      *__position._M_current = card;
      ppHVar1 = &(this->cards_).
                 super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
    }
    std::
    vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
    ::push_back(&this->card_knowledge_,initial_knowledge);
    return;
  }
  __assert_fail("card.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                ,0x52,
                "void hanabi_learning_env::HanabiHand::AddCard(HanabiCard, const CardKnowledge &)");
}

Assistant:

void HanabiHand::AddCard(HanabiCard card,
                         const CardKnowledge& initial_knowledge) {
  REQUIRE(card.IsValid());
  cards_.push_back(card);
  card_knowledge_.push_back(initial_knowledge);
}